

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  vfloat<4> vVar12;
  byte bVar13;
  BVH *bvh;
  size_t sVar14;
  void *pvVar15;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  undefined8 uVar29;
  vbool<4> vVar30;
  size_t sVar31;
  char cVar32;
  bool bVar33;
  uint uVar34;
  undefined4 uVar35;
  int iVar36;
  AABBNodeMB4D *node1;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  NodeRef root;
  size_t sVar40;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar41;
  NodeRef *pNVar42;
  float fVar43;
  vint4 ai;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  undefined1 in_ZMM0 [64];
  float fVar53;
  float fVar54;
  float fVar60;
  float fVar62;
  vint4 bi_11;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar64;
  undefined1 auVar57 [16];
  float fVar61;
  float fVar63;
  float fVar65;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar66;
  float fVar73;
  float fVar74;
  vint4 ai_2;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar75;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vint4 bi_3;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar100;
  vint4 bi_2;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  vint4 ai_11;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  vfloat4 a0;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar118;
  float fVar119;
  float fVar122;
  float fVar123;
  vint4 ai_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  vint4 ai_3;
  undefined1 auVar126 [16];
  float fVar129;
  float fVar130;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar132 [64];
  undefined1 auVar136 [64];
  undefined1 local_1978 [8];
  float fStack_1970;
  float fStack_196c;
  vbool<4> terminated;
  undefined4 local_18e8 [4];
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar29 = mm_lookupmask_ps._8_8_;
  uVar28 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar40 = (bvh->root).ptr;
  if (sVar40 != 8) {
    auVar72 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar49 = vpcmpeqd_avx(auVar72,(undefined1  [16])valid_i->field_0);
    auVar72 = *(undefined1 (*) [16])(ray + 0x80);
    auVar56 = ZEXT816(0) << 0x40;
    auVar59 = vcmpps_avx(auVar72,auVar56,5);
    auVar59 = vandps_avx(auVar59,auVar49);
    uVar37 = vmovmskps_avx(auVar59);
    if (uVar37 != 0) {
      uVar38 = (ulong)(uVar37 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar90._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar90._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar90._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar90._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar49 = vrsqrtps_avx(auVar90);
      fVar94 = auVar49._0_4_;
      fVar100 = auVar49._4_4_;
      fVar53 = auVar49._8_4_;
      fVar60 = auVar49._12_4_;
      pre.depth_scale.field_0.v[0] = fVar94 * 1.5 + fVar94 * fVar94 * fVar94 * auVar90._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] =
           fVar100 * 1.5 + fVar100 * fVar100 * fVar100 * auVar90._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar53 * 1.5 + fVar53 * fVar53 * fVar53 * auVar90._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar60 * 1.5 + fVar60 * fVar60 * fVar60 * auVar90._12_4_ * -0.5
      ;
      auVar49._8_4_ = 0x80000000;
      auVar49._0_8_ = 0x8000000080000000;
      auVar49._12_4_ = 0x80000000;
      while (uVar38 != 0) {
        lVar39 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
          }
        }
        auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar39 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar39 * 4 + 0x50)),0x1c);
        auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + lVar39 * 4 + 0x60)),0x28);
        fVar94 = *(float *)((long)pre.ray_space + lVar39 * 4 + -0x10);
        auVar107._0_4_ = auVar90._0_4_ * fVar94;
        auVar107._4_4_ = auVar90._4_4_ * fVar94;
        auVar107._8_4_ = auVar90._8_4_ * fVar94;
        auVar107._12_4_ = auVar90._12_4_ * fVar94;
        auVar104 = vshufpd_avx(auVar107,auVar107,1);
        auVar90 = vmovshdup_avx(auVar107);
        auVar113._0_4_ = auVar90._0_4_ ^ 0x80000000;
        auVar90 = vunpckhps_avx(auVar107,auVar56);
        auVar113._4_12_ = ZEXT812(0) << 0x20;
        auVar110 = vshufps_avx(auVar90,auVar113,0x41);
        auVar109._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
        auVar109._8_8_ = auVar104._8_8_ ^ auVar49._8_8_;
        auVar109 = vinsertps_avx(auVar109,auVar107,0x2a);
        auVar90 = vdpps_avx(auVar110,auVar110,0x7f);
        auVar104 = vdpps_avx(auVar109,auVar109,0x7f);
        auVar90 = vcmpps_avx(auVar104,auVar90,1);
        auVar90 = vshufps_avx(auVar90,auVar90,0);
        auVar90 = vblendvps_avx(auVar109,auVar110,auVar90);
        auVar104 = vdpps_avx(auVar90,auVar90,0x7f);
        auVar109 = vrsqrtss_avx(auVar104,auVar104);
        fVar100 = auVar109._0_4_;
        auVar104 = ZEXT416((uint)(fVar100 * 1.5 - auVar104._0_4_ * 0.5 * fVar100 * fVar100 * fVar100
                                 ));
        auVar104 = vshufps_avx(auVar104,auVar104,0);
        auVar110._0_4_ = auVar90._0_4_ * auVar104._0_4_;
        auVar110._4_4_ = auVar90._4_4_ * auVar104._4_4_;
        auVar110._8_4_ = auVar90._8_4_ * auVar104._8_4_;
        auVar110._12_4_ = auVar90._12_4_ * auVar104._12_4_;
        auVar90 = vshufps_avx(auVar110,auVar110,0xc9);
        auVar104 = vshufps_avx(auVar107,auVar107,0xc9);
        auVar120._0_4_ = auVar104._0_4_ * auVar110._0_4_;
        auVar120._4_4_ = auVar104._4_4_ * auVar110._4_4_;
        auVar120._8_4_ = auVar104._8_4_ * auVar110._8_4_;
        auVar120._12_4_ = auVar104._12_4_ * auVar110._12_4_;
        auVar114._0_4_ = auVar107._0_4_ * auVar90._0_4_;
        auVar114._4_4_ = auVar107._4_4_ * auVar90._4_4_;
        auVar114._8_4_ = auVar107._8_4_ * auVar90._8_4_;
        auVar114._12_4_ = auVar107._12_4_ * auVar90._12_4_;
        auVar90 = vsubps_avx(auVar114,auVar120);
        auVar109 = vshufps_avx(auVar90,auVar90,0xc9);
        auVar90 = vdpps_avx(auVar109,auVar109,0x7f);
        uVar38 = uVar38 & uVar38 - 1;
        auVar104 = vrsqrtss_avx(auVar90,auVar90);
        fVar100 = auVar104._0_4_;
        auVar90 = ZEXT416((uint)(fVar100 * 1.5 - auVar90._0_4_ * 0.5 * fVar100 * fVar100 * fVar100))
        ;
        auVar90 = vshufps_avx(auVar90,auVar90,0);
        auVar115._0_4_ = auVar90._0_4_ * auVar109._0_4_;
        auVar115._4_4_ = auVar90._4_4_ * auVar109._4_4_;
        auVar115._8_4_ = auVar90._8_4_ * auVar109._8_4_;
        auVar115._12_4_ = auVar90._12_4_ * auVar109._12_4_;
        auVar104._0_4_ = fVar94 * auVar107._0_4_;
        auVar104._4_4_ = fVar94 * auVar107._4_4_;
        auVar104._8_4_ = fVar94 * auVar107._8_4_;
        auVar104._12_4_ = fVar94 * auVar107._12_4_;
        auVar109 = vunpcklps_avx(auVar110,auVar104);
        auVar90 = vunpckhps_avx(auVar110,auVar104);
        auVar110 = vunpcklps_avx(auVar115,auVar56);
        auVar104 = vunpckhps_avx(auVar115,auVar56);
        aVar18 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar90,auVar104);
        aVar19 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar109,auVar110);
        aVar17 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar109,auVar110);
        pre.ray_space[lVar39].vx.field_0 = aVar19;
        pre.ray_space[lVar39].vy.field_0 = aVar17;
        pre.ray_space[lVar39].vz.field_0 = aVar18;
      }
      auVar105._8_4_ = 0x7fffffff;
      auVar105._0_8_ = 0x7fffffff7fffffff;
      auVar105._12_4_ = 0x7fffffff;
      auVar108._8_4_ = 0x219392ef;
      auVar108._0_8_ = 0x219392ef219392ef;
      auVar108._12_4_ = 0x219392ef;
      auVar49 = vandps_avx(auVar105,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar49 = vcmpps_avx(auVar49,auVar108,1);
      auVar49 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar108,auVar49)
      ;
      auVar111._8_4_ = 0x3f800000;
      auVar111._0_8_ = 0x3f8000003f800000;
      auVar111._12_4_ = 0x3f800000;
      auVar56 = vrcpps_avx(auVar49);
      fVar94 = auVar56._0_4_;
      auVar84._0_4_ = auVar49._0_4_ * fVar94;
      fVar100 = auVar56._4_4_;
      auVar84._4_4_ = auVar49._4_4_ * fVar100;
      fVar53 = auVar56._8_4_;
      auVar84._8_4_ = auVar49._8_4_ * fVar53;
      fVar60 = auVar56._12_4_;
      auVar84._12_4_ = auVar49._12_4_ * fVar60;
      auVar49 = vsubps_avx(auVar111,auVar84);
      tray.rdir.field_0._16_4_ = fVar94 + fVar94 * auVar49._0_4_;
      tray.rdir.field_0._20_4_ = fVar100 + fVar100 * auVar49._4_4_;
      tray.rdir.field_0._24_4_ = fVar53 + fVar53 * auVar49._8_4_;
      tray.rdir.field_0._28_4_ = fVar60 + fVar60 * auVar49._12_4_;
      auVar104 = ZEXT816(0) << 0x40;
      auVar49 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar104,5);
      auVar95._8_4_ = 0x20;
      auVar95._0_8_ = 0x2000000020;
      auVar95._12_4_ = 0x20;
      auVar101._8_4_ = 0x30;
      auVar101._0_8_ = 0x3000000030;
      auVar101._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar101,auVar95,auVar49)
      ;
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x20);
      auVar49 = vandps_avx(auVar105,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar49 = vcmpps_avx(auVar49,auVar108,1);
      auVar56 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar108,auVar49)
      ;
      auVar49 = vandps_avx(auVar105,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar49 = vcmpps_avx(auVar49,auVar108,1);
      auVar49 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar108,auVar49)
      ;
      auVar90 = vrcpps_avx(auVar56);
      fVar94 = auVar90._0_4_;
      auVar67._0_4_ = auVar56._0_4_ * fVar94;
      fVar100 = auVar90._4_4_;
      auVar67._4_4_ = auVar56._4_4_ * fVar100;
      fVar53 = auVar90._8_4_;
      auVar67._8_4_ = auVar56._8_4_ * fVar53;
      fVar60 = auVar90._12_4_;
      auVar67._12_4_ = auVar56._12_4_ * fVar60;
      auVar56 = vsubps_avx(auVar111,auVar67);
      tray.rdir.field_0._0_4_ = fVar94 + fVar94 * auVar56._0_4_;
      tray.rdir.field_0._4_4_ = fVar100 + fVar100 * auVar56._4_4_;
      tray.rdir.field_0._8_4_ = fVar53 + fVar53 * auVar56._8_4_;
      tray.rdir.field_0._12_4_ = fVar60 + fVar60 * auVar56._12_4_;
      auVar56 = vrcpps_avx(auVar49);
      fVar94 = auVar56._0_4_;
      auVar55._0_4_ = auVar49._0_4_ * fVar94;
      fVar100 = auVar56._4_4_;
      auVar55._4_4_ = auVar49._4_4_ * fVar100;
      fVar53 = auVar56._8_4_;
      auVar55._8_4_ = auVar49._8_4_ * fVar53;
      fVar60 = auVar56._12_4_;
      auVar55._12_4_ = auVar49._12_4_ * fVar60;
      auVar49 = vsubps_avx(auVar111,auVar55);
      tray.rdir.field_0._32_4_ = fVar94 + fVar94 * auVar49._0_4_;
      tray.rdir.field_0._36_4_ = fVar100 + fVar100 * auVar49._4_4_;
      tray.rdir.field_0._40_4_ = fVar53 + fVar53 * auVar49._8_4_;
      tray.rdir.field_0._44_4_ = fVar60 + fVar60 * auVar49._12_4_;
      auVar49 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar104,1);
      auVar76._8_4_ = 0x10;
      auVar76._0_8_ = 0x1000000010;
      auVar76._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar49,auVar76);
      auVar49 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar104,5);
      auVar68._8_4_ = 0x40;
      auVar68._0_8_ = 0x4000000040;
      auVar68._12_4_ = 0x40;
      auVar77._8_4_ = 0x50;
      auVar77._0_8_ = 0x5000000050;
      auVar77._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar77,auVar68,auVar49);
      auVar49 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar104);
      auVar72 = vmaxps_avx(auVar72,auVar104);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar132 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar49,auVar59);
      auVar56._8_4_ = 0xff800000;
      auVar56._0_8_ = 0xff800000ff800000;
      auVar56._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar56,auVar72,auVar59);
      auVar72 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar59._0_4_ ^ auVar72._0_4_;
      terminated.field_0._4_4_ = auVar59._4_4_ ^ auVar72._4_4_;
      terminated.field_0._8_4_ = auVar59._8_4_ ^ auVar72._8_4_;
      terminated.field_0._12_4_ = auVar59._12_4_ ^ auVar72._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar37 = 3;
      }
      else {
        uVar37 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar42 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar41 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar40;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00ec804b:
      do {
        do {
          root.ptr = pNVar42[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec87f3;
          pNVar42 = pNVar42 + -1;
          paVar41 = paVar41 + -1;
          vVar12.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar41->v;
          auVar136 = ZEXT1664((undefined1  [16])vVar12.field_0);
          auVar72 = vcmpps_avx((undefined1  [16])vVar12.field_0,(undefined1  [16])tray.tfar.field_0,
                               1);
          uVar34 = vmovmskps_avx(auVar72);
        } while (uVar34 == 0);
        uVar38 = (ulong)(uVar34 & 0xff);
        uVar34 = POPCOUNT(uVar34 & 0xff);
        if (uVar37 < uVar34) {
LAB_00ec8089:
          do {
            vVar30.field_0 = terminated.field_0;
            lVar39 = -0x10;
            sVar40 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec87f3;
              auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar136._0_16_,6);
              if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar72[0xf] < '\0') {
                bVar13 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar15 = This->leafIntersector;
                local_18e8._0_8_ = uVar28;
                local_18e8._8_8_ = uVar29;
                uVar34 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                uVar38 = (ulong)(uVar34 ^ 0xf);
                while (uVar38 != 0) {
                  lVar39 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                    }
                  }
                  uVar38 = uVar38 & uVar38 - 1;
                  cVar32 = (**(code **)((long)pvVar15 + (ulong)bVar13 * 0x40 + 0x18))
                                     (&pre,ray,lVar39,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar132 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  if (cVar32 != '\0') {
                    local_18e8[lVar39] = 0xffffffff;
                  }
                }
                auVar22._8_4_ = local_18e8[2];
                auVar22._12_4_ = local_18e8[3];
                auVar22._0_4_ = local_18e8[0];
                auVar22._4_4_ = local_18e8[1];
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])vVar30.field_0,auVar22);
                auVar72 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar72[0xf]) goto LAB_00ec87f3;
                auVar71._8_4_ = 0xff800000;
                auVar71._0_8_ = 0xff800000ff800000;
                auVar71._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar71,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_00ec804b;
            }
            uVar38 = root.ptr & 0xfffffffffffffff0;
            uVar34 = (uint)root.ptr & 7;
            auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar136._0_16_,6);
            aVar131 = auVar132._0_16_;
            for (; (auVar136 = ZEXT1664((undefined1  [16])aVar131), lVar39 != 0 &&
                   (sVar14 = *(size_t *)(uVar38 + 0x20 + lVar39 * 2), sVar14 != 8));
                lVar39 = lVar39 + 4) {
              if ((uVar34 == 6) || (uVar34 == 1)) {
                fVar94 = *(float *)(uVar38 + 0x90 + lVar39);
                fVar100 = *(float *)(uVar38 + 0x30 + lVar39);
                auVar49 = *(undefined1 (*) [16])(ray + 0x70);
                fVar53 = auVar49._0_4_;
                fVar60 = auVar49._4_4_;
                fVar62 = auVar49._8_4_;
                fVar64 = auVar49._12_4_;
                auVar44._0_4_ = fVar53 * fVar94 + fVar100;
                auVar44._4_4_ = fVar60 * fVar94 + fVar100;
                auVar44._8_4_ = fVar62 * fVar94 + fVar100;
                auVar44._12_4_ = fVar64 * fVar94 + fVar100;
                fVar94 = *(float *)(uVar38 + 0xb0 + lVar39);
                fVar100 = *(float *)(uVar38 + 0x50 + lVar39);
                auVar69._0_4_ = fVar53 * fVar94 + fVar100;
                auVar69._4_4_ = fVar60 * fVar94 + fVar100;
                auVar69._8_4_ = fVar62 * fVar94 + fVar100;
                auVar69._12_4_ = fVar64 * fVar94 + fVar100;
                fVar94 = *(float *)(uVar38 + 0xd0 + lVar39);
                fVar100 = *(float *)(uVar38 + 0x70 + lVar39);
                auVar78._0_4_ = fVar53 * fVar94 + fVar100;
                auVar78._4_4_ = fVar60 * fVar94 + fVar100;
                auVar78._8_4_ = fVar62 * fVar94 + fVar100;
                auVar78._12_4_ = fVar64 * fVar94 + fVar100;
                fVar94 = *(float *)(uVar38 + 0xa0 + lVar39);
                fVar100 = *(float *)(uVar38 + 0x40 + lVar39);
                auVar85._0_4_ = fVar53 * fVar94 + fVar100;
                auVar85._4_4_ = fVar60 * fVar94 + fVar100;
                auVar85._8_4_ = fVar62 * fVar94 + fVar100;
                auVar85._12_4_ = fVar64 * fVar94 + fVar100;
                fVar94 = *(float *)(uVar38 + 0xc0 + lVar39);
                fVar100 = *(float *)(uVar38 + 0x60 + lVar39);
                auVar91._0_4_ = fVar53 * fVar94 + fVar100;
                auVar91._4_4_ = fVar60 * fVar94 + fVar100;
                auVar91._8_4_ = fVar62 * fVar94 + fVar100;
                auVar91._12_4_ = fVar64 * fVar94 + fVar100;
                fVar94 = *(float *)(uVar38 + 0xe0 + lVar39);
                fVar100 = *(float *)(uVar38 + 0x80 + lVar39);
                auVar96._0_4_ = fVar53 * fVar94 + fVar100;
                auVar96._4_4_ = fVar60 * fVar94 + fVar100;
                auVar96._8_4_ = fVar62 * fVar94 + fVar100;
                auVar96._12_4_ = fVar64 * fVar94 + fVar100;
                auVar23._4_4_ = tray.org.field_0._4_4_;
                auVar23._0_4_ = tray.org.field_0._0_4_;
                auVar23._8_4_ = tray.org.field_0._8_4_;
                auVar23._12_4_ = tray.org.field_0._12_4_;
                auVar24._8_8_ = tray.org.field_0._24_8_;
                auVar24._0_8_ = tray.org.field_0._16_8_;
                auVar56 = vsubps_avx(auVar44,auVar23);
                auVar45._0_4_ = tray.rdir.field_0._0_4_ * auVar56._0_4_;
                auVar45._4_4_ = tray.rdir.field_0._4_4_ * auVar56._4_4_;
                auVar45._8_4_ = tray.rdir.field_0._8_4_ * auVar56._8_4_;
                auVar45._12_4_ = tray.rdir.field_0._12_4_ * auVar56._12_4_;
                auVar56 = vsubps_avx(auVar69,auVar24);
                auVar121._0_4_ = tray.rdir.field_0._16_4_ * auVar56._0_4_;
                auVar121._4_4_ = tray.rdir.field_0._20_4_ * auVar56._4_4_;
                auVar121._8_4_ = tray.rdir.field_0._24_4_ * auVar56._8_4_;
                auVar121._12_4_ = tray.rdir.field_0._28_4_ * auVar56._12_4_;
                auVar56 = vsubps_avx(auVar78,(undefined1  [16])tray.org.field_0.field_0.z.field_0);
                auVar126._0_4_ = auVar56._0_4_ * (float)tray.rdir.field_0._32_4_;
                auVar126._4_4_ = auVar56._4_4_ * (float)tray.rdir.field_0._36_4_;
                auVar126._8_4_ = auVar56._8_4_ * (float)tray.rdir.field_0._40_4_;
                auVar126._12_4_ = auVar56._12_4_ * (float)tray.rdir.field_0._44_4_;
                auVar56 = vsubps_avx(auVar85,auVar23);
                auVar86._0_4_ = tray.rdir.field_0._0_4_ * auVar56._0_4_;
                auVar86._4_4_ = tray.rdir.field_0._4_4_ * auVar56._4_4_;
                auVar86._8_4_ = tray.rdir.field_0._8_4_ * auVar56._8_4_;
                auVar86._12_4_ = tray.rdir.field_0._12_4_ * auVar56._12_4_;
                auVar56 = vsubps_avx(auVar91,auVar24);
                auVar92._0_4_ = tray.rdir.field_0._16_4_ * auVar56._0_4_;
                auVar92._4_4_ = tray.rdir.field_0._20_4_ * auVar56._4_4_;
                auVar92._8_4_ = tray.rdir.field_0._24_4_ * auVar56._8_4_;
                auVar92._12_4_ = tray.rdir.field_0._28_4_ * auVar56._12_4_;
                auVar56 = vsubps_avx(auVar96,(undefined1  [16])tray.org.field_0.field_0.z.field_0);
                auVar79._0_4_ = auVar56._0_4_ * (float)tray.rdir.field_0._32_4_;
                auVar79._4_4_ = auVar56._4_4_ * (float)tray.rdir.field_0._36_4_;
                auVar79._8_4_ = auVar56._8_4_ * (float)tray.rdir.field_0._40_4_;
                auVar79._12_4_ = auVar56._12_4_ * (float)tray.rdir.field_0._44_4_;
                auVar56 = vpminsd_avx(auVar45,auVar86);
                auVar90 = vpminsd_avx(auVar121,auVar92);
                auVar56 = vpmaxsd_avx(auVar56,auVar90);
                auVar90 = vpminsd_avx(auVar126,auVar79);
                auVar90 = vpmaxsd_avx(auVar56,auVar90);
                auVar56 = vpmaxsd_avx(auVar45,auVar86);
                auVar104 = vpmaxsd_avx(auVar121,auVar92);
                auVar109 = vpminsd_avx(auVar56,auVar104);
                auVar56 = vpmaxsd_avx(auVar126,auVar79);
                auVar104 = vpmaxsd_avx(auVar90,(undefined1  [16])tray.tnear.field_0);
                auVar56 = vpminsd_avx(auVar109,auVar56);
                auVar56 = vpminsd_avx(auVar56,(undefined1  [16])tray.tfar.field_0);
                auVar56 = vcmpps_avx(auVar104,auVar56,2);
                if (uVar34 == 6) {
                  uVar35 = *(undefined4 *)(uVar38 + 0xf0 + lVar39);
                  auVar80._4_4_ = uVar35;
                  auVar80._0_4_ = uVar35;
                  auVar80._8_4_ = uVar35;
                  auVar80._12_4_ = uVar35;
                  auVar104 = vcmpps_avx(auVar80,auVar49,2);
                  uVar35 = *(undefined4 *)(uVar38 + 0x100 + lVar39);
                  auVar87._4_4_ = uVar35;
                  auVar87._0_4_ = uVar35;
                  auVar87._8_4_ = uVar35;
                  auVar87._12_4_ = uVar35;
                  auVar49 = vcmpps_avx(auVar49,auVar87,1);
                  auVar49 = vandps_avx(auVar104,auVar49);
                  auVar56 = vandps_avx(auVar49,auVar56);
                }
              }
              else {
                fVar94 = *(float *)(uVar38 + 0x60 + lVar39);
                fVar100 = *(float *)(uVar38 + 0x70 + lVar39);
                fVar53 = *(float *)(uVar38 + 0x80 + lVar39);
                fVar60 = *(float *)(uVar38 + 0x90 + lVar39);
                fVar62 = *(float *)(uVar38 + 0xa0 + lVar39);
                fVar64 = *(float *)(uVar38 + 0xf0 + lVar39);
                fVar1 = *(float *)(uVar38 + 0x100 + lVar39);
                fVar2 = *(float *)(uVar38 + 0x110 + lVar39);
                fVar3 = *(float *)(uVar38 + 0x120 + lVar39);
                fVar4 = *(float *)(uVar38 + 0x130 + lVar39);
                fVar5 = *(float *)(uVar38 + 0x140 + lVar39);
                auVar49 = *(undefined1 (*) [16])(ray + 0x70);
                auVar81._8_4_ = 0x3f800000;
                auVar81._0_8_ = 0x3f8000003f800000;
                auVar81._12_4_ = 0x3f800000;
                auVar56 = vsubps_avx(auVar81,auVar49);
                fVar119 = auVar49._0_4_;
                fVar122 = auVar49._4_4_;
                fVar123 = auVar49._8_4_;
                fVar124 = auVar49._12_4_;
                fVar125 = auVar56._0_4_;
                fVar130 = fVar125 * 0.0;
                fVar127 = auVar56._4_4_;
                fVar133 = fVar127 * 0.0;
                fVar128 = auVar56._8_4_;
                fVar134 = fVar128 * 0.0;
                fVar129 = auVar56._12_4_;
                fVar135 = fVar129 * 0.0;
                local_1978._4_4_ = fVar133 + fVar122 * fVar1;
                local_1978._0_4_ = fVar130 + fVar119 * fVar1;
                fStack_1970 = fVar134 + fVar123 * fVar1;
                fStack_196c = fVar135 + fVar124 * fVar1;
                fVar1 = *(float *)(uVar38 + 0xb0 + lVar39);
                fVar6 = *(float *)(uVar38 + 0x30 + lVar39);
                auVar70._0_4_ =
                     fVar6 * (float)tray.dir.field_0._0_4_ +
                     fVar94 * (float)tray.dir.field_0._16_4_ +
                     fVar60 * (float)tray.dir.field_0._32_4_;
                auVar70._4_4_ =
                     fVar6 * (float)tray.dir.field_0._4_4_ +
                     fVar94 * (float)tray.dir.field_0._20_4_ +
                     fVar60 * (float)tray.dir.field_0._36_4_;
                auVar70._8_4_ =
                     fVar6 * (float)tray.dir.field_0._8_4_ +
                     fVar94 * (float)tray.dir.field_0._24_4_ +
                     fVar60 * (float)tray.dir.field_0._40_4_;
                auVar70._12_4_ =
                     fVar6 * (float)tray.dir.field_0._12_4_ +
                     fVar94 * (float)tray.dir.field_0._28_4_ +
                     fVar60 * (float)tray.dir.field_0._44_4_;
                fVar7 = *(float *)(uVar38 + 0x40 + lVar39);
                auVar97._0_4_ =
                     fVar100 * (float)tray.dir.field_0._16_4_ +
                     fVar62 * (float)tray.dir.field_0._32_4_ + fVar7 * (float)tray.dir.field_0._0_4_
                ;
                auVar97._4_4_ =
                     fVar100 * (float)tray.dir.field_0._20_4_ +
                     fVar62 * (float)tray.dir.field_0._36_4_ + fVar7 * (float)tray.dir.field_0._4_4_
                ;
                auVar97._8_4_ =
                     fVar100 * (float)tray.dir.field_0._24_4_ +
                     fVar62 * (float)tray.dir.field_0._40_4_ + fVar7 * (float)tray.dir.field_0._8_4_
                ;
                auVar97._12_4_ =
                     fVar100 * (float)tray.dir.field_0._28_4_ +
                     fVar62 * (float)tray.dir.field_0._44_4_ +
                     fVar7 * (float)tray.dir.field_0._12_4_;
                fVar8 = *(float *)(uVar38 + 0x50 + lVar39);
                auVar46._0_4_ =
                     fVar8 * (float)tray.dir.field_0._0_4_ +
                     fVar53 * (float)tray.dir.field_0._16_4_ +
                     fVar1 * (float)tray.dir.field_0._32_4_;
                auVar46._4_4_ =
                     fVar8 * (float)tray.dir.field_0._4_4_ +
                     fVar53 * (float)tray.dir.field_0._20_4_ +
                     fVar1 * (float)tray.dir.field_0._36_4_;
                auVar46._8_4_ =
                     fVar8 * (float)tray.dir.field_0._8_4_ +
                     fVar53 * (float)tray.dir.field_0._24_4_ +
                     fVar1 * (float)tray.dir.field_0._40_4_;
                auVar46._12_4_ =
                     fVar8 * (float)tray.dir.field_0._12_4_ +
                     fVar53 * (float)tray.dir.field_0._28_4_ +
                     fVar1 * (float)tray.dir.field_0._44_4_;
                auVar102._8_4_ = 0x7fffffff;
                auVar102._0_8_ = 0x7fffffff7fffffff;
                auVar102._12_4_ = 0x7fffffff;
                auVar49 = vandps_avx(auVar70,auVar102);
                auVar106._8_4_ = 0x219392ef;
                auVar106._0_8_ = 0x219392ef219392ef;
                auVar106._12_4_ = 0x219392ef;
                auVar49 = vcmpps_avx(auVar49,auVar106,1);
                auVar56 = vblendvps_avx(auVar70,auVar106,auVar49);
                auVar49 = vandps_avx(auVar97,auVar102);
                auVar49 = vcmpps_avx(auVar49,auVar106,1);
                auVar90 = vblendvps_avx(auVar97,auVar106,auVar49);
                auVar49 = vandps_avx(auVar46,auVar102);
                auVar49 = vcmpps_avx(auVar49,auVar106,1);
                auVar49 = vblendvps_avx(auVar46,auVar106,auVar49);
                auVar104 = vrcpps_avx(auVar56);
                fVar66 = auVar104._0_4_;
                auVar57._0_4_ = fVar66 * auVar56._0_4_;
                fVar73 = auVar104._4_4_;
                auVar57._4_4_ = fVar73 * auVar56._4_4_;
                fVar74 = auVar104._8_4_;
                auVar57._8_4_ = fVar74 * auVar56._8_4_;
                fVar75 = auVar104._12_4_;
                auVar57._12_4_ = fVar75 * auVar56._12_4_;
                auVar56 = vsubps_avx(auVar81,auVar57);
                fVar66 = fVar66 + fVar66 * auVar56._0_4_;
                fVar73 = fVar73 + fVar73 * auVar56._4_4_;
                fVar74 = fVar74 + fVar74 * auVar56._8_4_;
                fVar75 = fVar75 + fVar75 * auVar56._12_4_;
                auVar56 = vrcpps_avx(auVar90);
                fVar54 = auVar56._0_4_;
                auVar98._0_4_ = fVar54 * auVar90._0_4_;
                fVar61 = auVar56._4_4_;
                auVar98._4_4_ = fVar61 * auVar90._4_4_;
                fVar63 = auVar56._8_4_;
                auVar98._8_4_ = fVar63 * auVar90._8_4_;
                fVar65 = auVar56._12_4_;
                auVar98._12_4_ = fVar65 * auVar90._12_4_;
                auVar56 = vsubps_avx(auVar81,auVar98);
                fVar54 = fVar54 + fVar54 * auVar56._0_4_;
                fVar61 = fVar61 + fVar61 * auVar56._4_4_;
                fVar63 = fVar63 + fVar63 * auVar56._8_4_;
                fVar65 = fVar65 + fVar65 * auVar56._12_4_;
                auVar56 = vrcpps_avx(auVar49);
                fVar43 = auVar56._0_4_;
                auVar47._0_4_ = fVar43 * auVar49._0_4_;
                fVar50 = auVar56._4_4_;
                auVar47._4_4_ = fVar50 * auVar49._4_4_;
                fVar51 = auVar56._8_4_;
                auVar47._8_4_ = fVar51 * auVar49._8_4_;
                fVar52 = auVar56._12_4_;
                auVar47._12_4_ = fVar52 * auVar49._12_4_;
                auVar49 = vsubps_avx(auVar81,auVar47);
                fVar43 = fVar43 + fVar43 * auVar49._0_4_;
                fVar50 = fVar50 + fVar50 * auVar49._4_4_;
                fVar51 = fVar51 + fVar51 * auVar49._8_4_;
                fVar52 = fVar52 + fVar52 * auVar49._12_4_;
                fVar9 = *(float *)(uVar38 + 0xc0 + lVar39);
                fVar10 = *(float *)(uVar38 + 0xd0 + lVar39);
                fVar11 = *(float *)(uVar38 + 0xe0 + lVar39);
                fVar112 = (float)tray.org.field_0._16_8_;
                fVar116 = (float)((ulong)tray.org.field_0._16_8_ >> 0x20);
                fVar117 = (float)tray.org.field_0._24_8_;
                fVar118 = (float)((ulong)tray.org.field_0._24_8_ >> 0x20);
                auVar88._0_4_ =
                     fVar6 * (float)tray.org.field_0._0_4_ +
                     fVar112 * fVar94 + fVar60 * (float)tray.org.field_0._32_4_ + fVar9;
                auVar88._4_4_ =
                     fVar6 * (float)tray.org.field_0._4_4_ +
                     fVar116 * fVar94 + fVar60 * (float)tray.org.field_0._36_4_ + fVar9;
                auVar88._8_4_ =
                     fVar6 * (float)tray.org.field_0._8_4_ +
                     fVar117 * fVar94 + fVar60 * (float)tray.org.field_0._40_4_ + fVar9;
                auVar88._12_4_ =
                     fVar6 * (float)tray.org.field_0._12_4_ +
                     fVar118 * fVar94 + fVar60 * (float)tray.org.field_0._44_4_ + fVar9;
                auVar82._0_4_ =
                     fVar7 * (float)tray.org.field_0._0_4_ +
                     fVar10 + fVar62 * (float)tray.org.field_0._32_4_ + fVar100 * fVar112;
                auVar82._4_4_ =
                     fVar7 * (float)tray.org.field_0._4_4_ +
                     fVar10 + fVar62 * (float)tray.org.field_0._36_4_ + fVar100 * fVar116;
                auVar82._8_4_ =
                     fVar7 * (float)tray.org.field_0._8_4_ +
                     fVar10 + fVar62 * (float)tray.org.field_0._40_4_ + fVar100 * fVar117;
                auVar82._12_4_ =
                     fVar7 * (float)tray.org.field_0._12_4_ +
                     fVar10 + fVar62 * (float)tray.org.field_0._44_4_ + fVar100 * fVar118;
                auVar132 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar93._0_4_ =
                     fVar8 * (float)tray.org.field_0._0_4_ +
                     fVar112 * fVar53 + fVar11 + fVar1 * (float)tray.org.field_0._32_4_;
                auVar93._4_4_ =
                     fVar8 * (float)tray.org.field_0._4_4_ +
                     fVar116 * fVar53 + fVar11 + fVar1 * (float)tray.org.field_0._36_4_;
                auVar93._8_4_ =
                     fVar8 * (float)tray.org.field_0._8_4_ +
                     fVar117 * fVar53 + fVar11 + fVar1 * (float)tray.org.field_0._40_4_;
                auVar93._12_4_ =
                     fVar8 * (float)tray.org.field_0._12_4_ +
                     fVar118 * fVar53 + fVar11 + fVar1 * (float)tray.org.field_0._44_4_;
                auVar26._4_4_ = fVar133 + fVar122 * fVar64;
                auVar26._0_4_ = fVar130 + fVar119 * fVar64;
                auVar26._8_4_ = fVar134 + fVar123 * fVar64;
                auVar26._12_4_ = fVar135 + fVar124 * fVar64;
                auVar49 = vsubps_avx(auVar26,auVar88);
                auVar25._4_4_ = fVar127 + fVar122 * fVar3;
                auVar25._0_4_ = fVar125 + fVar119 * fVar3;
                auVar25._8_4_ = fVar128 + fVar123 * fVar3;
                auVar25._12_4_ = fVar129 + fVar124 * fVar3;
                auVar56 = vsubps_avx(auVar25,auVar88);
                auVar99._0_4_ = fVar66 * auVar49._0_4_;
                auVar99._4_4_ = fVar73 * auVar49._4_4_;
                auVar99._8_4_ = fVar74 * auVar49._8_4_;
                auVar99._12_4_ = fVar75 * auVar49._12_4_;
                auVar89._0_4_ = fVar66 * auVar56._0_4_;
                auVar89._4_4_ = fVar73 * auVar56._4_4_;
                auVar89._8_4_ = fVar74 * auVar56._8_4_;
                auVar89._12_4_ = fVar75 * auVar56._12_4_;
                auVar49 = vsubps_avx(_local_1978,auVar82);
                auVar27._4_4_ = fVar127 + fVar122 * fVar4;
                auVar27._0_4_ = fVar125 + fVar119 * fVar4;
                auVar27._8_4_ = fVar128 + fVar123 * fVar4;
                auVar27._12_4_ = fVar129 + fVar124 * fVar4;
                auVar56 = vsubps_avx(auVar27,auVar82);
                auVar103._0_4_ = fVar54 * auVar49._0_4_;
                auVar103._4_4_ = fVar61 * auVar49._4_4_;
                auVar103._8_4_ = fVar63 * auVar49._8_4_;
                auVar103._12_4_ = fVar65 * auVar49._12_4_;
                auVar58._0_4_ = fVar54 * auVar56._0_4_;
                auVar58._4_4_ = fVar61 * auVar56._4_4_;
                auVar58._8_4_ = fVar63 * auVar56._8_4_;
                auVar58._12_4_ = fVar65 * auVar56._12_4_;
                auVar20._4_4_ = fVar133 + fVar122 * fVar2;
                auVar20._0_4_ = fVar130 + fVar119 * fVar2;
                auVar20._8_4_ = fVar134 + fVar123 * fVar2;
                auVar20._12_4_ = fVar135 + fVar124 * fVar2;
                auVar49 = vsubps_avx(auVar20,auVar93);
                auVar83._0_4_ = fVar43 * auVar49._0_4_;
                auVar83._4_4_ = fVar50 * auVar49._4_4_;
                auVar83._8_4_ = fVar51 * auVar49._8_4_;
                auVar83._12_4_ = fVar52 * auVar49._12_4_;
                auVar21._4_4_ = fVar127 + fVar122 * fVar5;
                auVar21._0_4_ = fVar125 + fVar119 * fVar5;
                auVar21._8_4_ = fVar128 + fVar123 * fVar5;
                auVar21._12_4_ = fVar129 + fVar124 * fVar5;
                auVar49 = vsubps_avx(auVar21,auVar93);
                auVar48._0_4_ = fVar43 * auVar49._0_4_;
                auVar48._4_4_ = fVar50 * auVar49._4_4_;
                auVar48._8_4_ = fVar51 * auVar49._8_4_;
                auVar48._12_4_ = fVar52 * auVar49._12_4_;
                auVar49 = vpminsd_avx(auVar99,auVar89);
                auVar56 = vpminsd_avx(auVar103,auVar58);
                auVar49 = vpmaxsd_avx(auVar49,auVar56);
                auVar56 = vpminsd_avx(auVar83,auVar48);
                auVar90 = vpmaxsd_avx(auVar49,auVar56);
                auVar49 = vpmaxsd_avx(auVar99,auVar89);
                auVar56 = vpmaxsd_avx(auVar103,auVar58);
                auVar104 = vpminsd_avx(auVar49,auVar56);
                auVar49 = vpmaxsd_avx(auVar83,auVar48);
                auVar56 = vpmaxsd_avx(auVar90,(undefined1  [16])tray.tnear.field_0);
                auVar49 = vpminsd_avx(auVar104,auVar49);
                auVar49 = vpminsd_avx(auVar49,(undefined1  [16])tray.tfar.field_0);
                auVar56 = vcmpps_avx(auVar56,auVar49,2);
              }
              auVar49 = vandps_avx(auVar56,auVar72);
              auVar49 = vpslld_avx(auVar49,0x1f);
              sVar31 = sVar40;
              aVar16 = aVar131;
              if (((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar49[0xf] < '\0') &&
                 (aVar16 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vblendvps_avx(auVar132._0_16_,auVar90,auVar49), sVar31 = sVar14,
                 sVar40 != 8)) {
                pNVar42->ptr = sVar40;
                pNVar42 = pNVar42 + 1;
                *paVar41 = aVar131;
                paVar41 = paVar41 + 1;
              }
              aVar131 = aVar16;
              sVar40 = sVar31;
            }
            if (sVar40 == 8) goto LAB_00ec860e;
            auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar131,6);
            uVar35 = vmovmskps_avx(auVar72);
            root.ptr = sVar40;
          } while ((byte)uVar37 < (byte)POPCOUNT(uVar35));
          pNVar42->ptr = sVar40;
          pNVar42 = pNVar42 + 1;
          *paVar41 = aVar131;
          paVar41 = paVar41 + 1;
LAB_00ec860e:
          iVar36 = 4;
        }
        else {
          while (uVar38 != 0) {
            sVar40 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> sVar40 & 1) == 0; sVar40 = sVar40 + 1) {
              }
            }
            uVar38 = uVar38 & uVar38 - 1;
            bVar33 = occluded1(This,bvh,root,sVar40,&pre,ray,&tray,context);
            if (bVar33) {
              terminated.field_0.i[sVar40] = -1;
            }
          }
          auVar72 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar36 = 3;
          auVar132 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar136 = ZEXT1664((undefined1  [16])vVar12.field_0);
          if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar72[0xf] < '\0') {
            auVar72._8_4_ = 0xff800000;
            auVar72._0_8_ = 0xff800000ff800000;
            auVar72._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar72,
                               (undefined1  [16])terminated.field_0);
            iVar36 = 2;
          }
          if (uVar37 < uVar34) goto LAB_00ec8089;
        }
      } while (iVar36 != 3);
LAB_00ec87f3:
      auVar72 = vandps_avx(auVar59,(undefined1  [16])terminated.field_0);
      auVar59._8_4_ = 0xff800000;
      auVar59._0_8_ = 0xff800000ff800000;
      auVar59._12_4_ = 0xff800000;
      auVar72 = vmaskmovps_avx(auVar72,auVar59);
      *(undefined1 (*) [16])(ray + 0x80) = auVar72;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }